

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmc_impl.cpp
# Opt level: O2

string * __thiscall
ui::(anonymous_namespace)::Format_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,float value,sizeApprox unit)

{
  int iVar1;
  stringstream ss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  stringstream local_198 [16];
  long local_188;
  undefined8 local_180 [2];
  uint auStack_170 [88];
  
  std::__cxx11::stringstream::stringstream(local_198);
  *(uint *)((long)auStack_170 + *(long *)(local_188 + -0x18)) =
       *(uint *)((long)auStack_170 + *(long *)(local_188 + -0x18)) & 0xfffffefb | 4;
  *(undefined8 *)((long)local_180 + *(long *)(local_188 + -0x18)) = 2;
  iVar1 = (int)this;
  std::ostream::operator<<(&local_188,value / (float)((ulong)this & 0xffffffff));
  if (iVar1 == 0x400) {
    std::__cxx11::stringbuf::str();
    std::operator+(__return_storage_ptr__,&local_1b8," KB");
  }
  else if (iVar1 == 0x100000) {
    std::__cxx11::stringbuf::str();
    std::operator+(__return_storage_ptr__,&local_1b8," MB");
  }
  else {
    if (iVar1 != 0x40000000) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"",(allocator<char> *)&local_1b8);
      goto LAB_001189d5;
    }
    std::__cxx11::stringbuf::str();
    std::operator+(__return_storage_ptr__,&local_1b8," GB");
  }
  std::__cxx11::string::~string((string *)&local_1b8);
LAB_001189d5:
  std::__cxx11::stringstream::~stringstream(local_198);
  return __return_storage_ptr__;
}

Assistant:

std::string Format(float value, sizeApprox unit) {
  std::stringstream ss;
  ss << std::fixed << std::setprecision(2) << (value / float(unit));

  switch (unit) {
    case KB:
      return ss.str() + " KB";
    case MB:
      return ss.str() + " MB";
    case GB:
      return ss.str() + " GB";
    default:
      return "";
  }
}